

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.cpp
# Opt level: O0

bool __thiscall DIS::Sensor::operator==(Sensor *this,Sensor *rhs)

{
  bool local_19;
  bool ivarsEqual;
  Sensor *rhs_local;
  Sensor *this_local;
  
  local_19 = this->_sensorOnOffStatus == rhs->_sensorOnOffStatus &&
             this->_sensorTypeSource == rhs->_sensorTypeSource;
  if (this->_sensorType != rhs->_sensorType) {
    local_19 = false;
  }
  if (this->_station != rhs->_station) {
    local_19 = false;
  }
  if (this->_quantity != rhs->_quantity) {
    local_19 = false;
  }
  if (this->_padding != rhs->_padding) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool Sensor::operator ==(const Sensor& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_sensorTypeSource == rhs._sensorTypeSource) ) ivarsEqual = false;
     if( ! (_sensorOnOffStatus == rhs._sensorOnOffStatus) ) ivarsEqual = false;
     if( ! (_sensorType == rhs._sensorType) ) ivarsEqual = false;
     if( ! (_station == rhs._station) ) ivarsEqual = false;
     if( ! (_quantity == rhs._quantity) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;

    return ivarsEqual;
 }